

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

void __thiscall
phmap::priv::
parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
::parallel_hash_set(parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
                    *this,allocator_type *alloc)

{
  long local_30;
  long local_28 [2];
  long *local_18;
  long *local_10;
  allocator_type *local_8;
  
  local_18 = local_28;
  local_28[0] = hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
                next_id<phmap::priv::StatefulTestingHash>()::gId;
  local_10 = &local_30;
  local_30 = hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
             next_id<phmap::priv::StatefulTestingEqual>()::gId;
  local_28[1] = 0;
  hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
  next_id<phmap::priv::StatefulTestingHash>()::gId =
       hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
       next_id<phmap::priv::StatefulTestingHash>()::gId + 1;
  hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
  next_id<phmap::priv::StatefulTestingEqual>()::gId =
       hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
       next_id<phmap::priv::StatefulTestingEqual>()::gId + 1;
  local_8 = alloc;
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<int>>
  ::parallel_hash_set<0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul>
            ((parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<int>>
              *)this,local_28 + 1);
  return;
}

Assistant:

explicit parallel_hash_set(const allocator_type& alloc)
        : parallel_hash_set(0, hasher(), key_equal(), alloc) {}